

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_calc_binning(fitsfile *fptr,int naxis,char (*colname) [71],double *minin,double *maxin,
                     double *binsizein,char (*minname) [71],char (*maxname) [71],
                     char (*binname) [71],int *colnum,long *haxes,float *amin,float *amax,
                     float *binsize,int *status)

{
  char (*in_RCX) [71];
  char (*in_RDX) [71];
  long *unaff_RBX;
  int in_ESI;
  int *in_RDI;
  double *unaff_R12;
  double *unaff_R13;
  double *unaff_R14;
  int *unaff_R15;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  int naxis1;
  int i;
  double binsized [4];
  double amaxd [4];
  double amind [4];
  int local_d0;
  int local_cc;
  double local_c8 [2];
  double *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  char (*in_stack_ffffffffffffff60) [71];
  int in_stack_ffffffffffffff6c;
  fitsfile *in_stack_ffffffffffffff70;
  double local_88 [7];
  undefined4 in_stack_ffffffffffffffc0;
  
  fits_calc_binningd(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_RCX,in_RDX,(char (*) [71])CONCAT44(in_ESI,in_stack_ffffffffffffffc0),in_RDI,
                     unaff_RBX,unaff_R12,unaff_R13,unaff_R14,unaff_R15);
  if (*_naxis1 == 0) {
    local_d0 = 4;
    if (in_ESI < 4) {
      local_d0 = in_ESI;
    }
    for (local_cc = 0; local_cc < local_d0; local_cc = local_cc + 1) {
      *(float *)(in_stack_00000030 + (long)local_cc * 4) = (float)local_88[local_cc];
      *(float *)(in_stack_00000038 + (long)local_cc * 4) = (float)local_88[(long)local_cc + -4];
      *(float *)(in_stack_00000040 + (long)local_cc * 4) = (float)local_c8[local_cc];
    }
  }
  return *_naxis1;
}

Assistant:

int fits_calc_binning(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      long *haxes,     /* O - number of bins in each histogram axis */
      float *amin,     /* O - lower bound of the histogram axes */
      float *amax,     /* O - upper bound of the histogram axes */
      float *binsize,  /* O - width of histogram bins/pixels on each axis */
      int *status)
{
  double amind[4], amaxd[4], binsized[4];

  fits_calc_binningd(fptr, naxis, colname, minin, maxin, binsizein, minname, maxname, binname,
		     colnum, haxes, amind, amaxd, binsized, status);

  /* Copy double precision values into single precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amin[i] = (float) amind[i];
      amax[i] = (float) amaxd[i];
      binsize[i] = (float) binsized[i];
    }
  }

  return (*status);
}